

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_slist.c
# Opt level: O0

ares_bool_t ares_slist_coin_flip(ares_slist_t *list)

{
  ulong uVar1;
  size_t bit;
  size_t total_bits;
  ares_slist_t *list_local;
  
  if (list->rand_bits == 0) {
    ares_rand_bytes(list->rand_state,list->rand_data,8);
    list->rand_bits = 0x40;
  }
  uVar1 = 0x40 - list->rand_bits;
  list->rand_bits = list->rand_bits - 1;
  return (uint)(((uint)list->rand_data[uVar1 >> 3] & 1 << ((byte)uVar1 & 7)) != 0);
}

Assistant:

static ares_bool_t ares_slist_coin_flip(ares_slist_t *list)
{
  size_t total_bits = sizeof(list->rand_data) * 8;
  size_t bit;

  /* Refill random data used for coin flips.  We pull this in 8 byte chunks.
   * ares_rand_bytes() has some built-in caching of its own so we don't need
   * to be excessive in caching ourselves.  Prefer to require less memory per
   * skiplist */
  if (list->rand_bits == 0) {
    ares_rand_bytes(list->rand_state, list->rand_data, sizeof(list->rand_data));
    list->rand_bits = total_bits;
  }

  bit = total_bits - list->rand_bits;
  list->rand_bits--;

  return (list->rand_data[bit / 8] & (1 << (bit % 8))) ? ARES_TRUE : ARES_FALSE;
}